

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O1

Violation mp::
          ComputeViolation<std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::TanhId,mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
                    (CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::TanhId>
                     *c,VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *x)

{
  int iVar1;
  CtxVal CVar2;
  pointer pdVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  Violation VVar7;
  
  iVar1 = (c->super_FunctionalConstraint).result_var_;
  pdVar3 = (x->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar5 = pdVar3[iVar1];
  if (x->recomp_vals_ == false) {
    dVar4 = tanh(pdVar3[(c->
                        super_CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::TanhId>
                        ).args_._M_elems[0]]);
    dVar4 = dVar5 - dVar4;
    CVar2 = (c->super_FunctionalConstraint).ctx.value_;
    if (CVar2 != CTX_POS) {
      if (CVar2 == CTX_NEG) {
        dVar4 = -dVar4;
      }
      else {
        if (CVar2 != CTX_MIX) {
          dVar5 = 0.0;
          dVar4 = INFINITY;
          goto LAB_0023f44e;
        }
        dVar4 = ABS(dVar4);
      }
    }
    dVar5 = (x->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar1];
  }
  else {
    dVar6 = (x->lb_).data_[iVar1] - dVar5;
    dVar4 = dVar5 - (x->ub_).data_[iVar1];
    if (dVar4 <= dVar6) {
      dVar4 = dVar6;
    }
    if (dVar4 <= 0.0) {
      dVar4 = 0.0;
    }
    dVar4 = dVar4 + ABS(dVar5 - (x->x_raw_).data_[iVar1]);
  }
LAB_0023f44e:
  VVar7.valX_ = dVar5;
  VVar7.viol_ = dVar4;
  return VVar7;
}

Assistant:

Violation ComputeViolation(
    const CustomFunctionalConstraint<Args, Params, NumOrLogic, Id>& c,
    const VarVec& x) {
  auto resvar = c.GetResultVar();
  if (!x.recomp_vals()) {    // solver's var values: normal check
    auto viol = x[resvar] - ComputeValue(c, x);
    switch (c.GetContext().GetValue()) {
    case Context::CTX_MIX:
      return {std::fabs(viol), x[resvar]};
    case Context::CTX_POS:
      return {viol, x[resvar]};
    case Context::CTX_NEG:
      return {-viol, x[resvar]};
    default:
      return {INFINITY, 0.0};
    }
  }
  return                              // recomputed var minus solver's
  { std::fabs(x[resvar] - x.raw(resvar))
        + std::max(0.0, x.bounds_viol(resvar)), x[resvar]};
}